

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O0

mz_bool mz_zip_writer_init_cfile(mz_zip_archive *pZip,FILE *pFile,mz_uint flags)

{
  mz_bool mVar1;
  __off64_t _Var2;
  uint in_EDX;
  undefined8 in_RSI;
  long in_RDI;
  mz_uint64 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  uint local_4;
  
  *(code **)(in_RDI + 0x50) = mz_zip_file_write_func;
  *(undefined8 *)(in_RDI + 0x58) = 0;
  if ((in_EDX & 0x8000) != 0) {
    *(code **)(in_RDI + 0x48) = mz_zip_file_read_func;
  }
  *(long *)(in_RDI + 0x60) = in_RDI;
  mVar1 = mz_zip_writer_init_v2
                    ((mz_zip_archive *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                     in_stack_ffffffffffffffd8,0);
  if (mVar1 != 0) {
    *(undefined8 *)(*(long *)(in_RDI + 0x68) + 0x70) = in_RSI;
    _Var2 = ftello64(*(FILE **)(*(long *)(in_RDI + 0x68) + 0x70));
    *(__off64_t *)(*(long *)(in_RDI + 0x68) + 0x78) = _Var2;
    *(undefined4 *)(in_RDI + 0x18) = 5;
  }
  local_4 = (uint)(mVar1 != 0);
  return local_4;
}

Assistant:

mz_bool mz_zip_writer_init_cfile(mz_zip_archive *pZip, MZ_FILE *pFile,
                                 mz_uint flags) {
  pZip->m_pWrite = mz_zip_file_write_func;
  pZip->m_pNeeds_keepalive = NULL;

  if (flags & MZ_ZIP_FLAG_WRITE_ALLOW_READING)
    pZip->m_pRead = mz_zip_file_read_func;

  pZip->m_pIO_opaque = pZip;

  if (!mz_zip_writer_init_v2(pZip, 0, flags))
    return MZ_FALSE;

  pZip->m_pState->m_pFile = pFile;
  pZip->m_pState->m_file_archive_start_ofs =
      MZ_FTELL64(pZip->m_pState->m_pFile);
  pZip->m_zip_type = MZ_ZIP_TYPE_CFILE;

  return MZ_TRUE;
}